

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O1

void get_max_cover_static2<128ul,3>
               (vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *sets,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *names,vector<unsigned_long,_std::allocator<unsigned_long>_> *_begin,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *_end,bool print_progress)

{
  pointer puVar1;
  pointer puVar2;
  pointer paVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  size_t j;
  array<unsigned_long,_3UL> *collection;
  pointer paVar7;
  size_t N;
  size_type n;
  size_t progress;
  size_t this_count;
  vector<std::bitset<128UL>,_std::allocator<std::bitset<128UL>_>_> binary_sets;
  collection end;
  collection indices;
  pair<unsigned_long,_std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>_>
  local_f8;
  ulong local_d8;
  size_type local_d0;
  size_type local_c8;
  unsigned_long local_c0;
  size_t local_b8;
  vector<std::bitset<128UL>,_std::allocator<std::bitset<128UL>_>_> local_b0;
  anon_class_56_7_64ceefa5 local_98;
  collection local_60;
  collection local_48;
  
  BitSetsFromSets<128ul>(&local_b0,sets,names);
  local_d0 = ((long)(sets->
                    super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(sets->
                    super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  local_d8 = 1;
  lVar6 = 0;
  do {
    local_d8 = local_d8 * (local_d0 + lVar6);
    lVar6 = lVar6 + -1;
  } while (lVar6 != -3);
  uVar5 = 1;
  do {
    local_d8 = local_d8 / uVar5;
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  puVar1 = (_begin->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (_end->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = 0;
  do {
    local_48._M_elems[lVar6] = puVar1[lVar6];
    local_60._M_elems[lVar6] = puVar2[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_f8.first = 0;
  local_f8.second.
  super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.second.
  super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.second.
  super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.this_count = &local_b8;
  local_b8 = 0;
  local_98.progress = &local_c0;
  local_c0 = 0;
  local_98.indices = &local_48;
  local_98.end = &local_60;
  local_98.best = &local_f8;
  local_98.n = &local_d0;
  local_c8 = (names->_M_h)._M_element_count;
  local_98.binary_sets = &local_b0;
  ProgressIndicator<std::exception,get_max_cover_static2<128ul,3>(std::vector<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::allocator<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>const&,std::unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,bool)::_lambda()_1_,unsigned_long&,unsigned_long,unsigned_long&,unsigned_long_const&>
            ("\r%zu/%zu @ %zu/%zu",print_progress,&local_98,&(local_98.best)->first,&local_c8,
             local_98.progress,&local_d8);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  local_98.indices._0_1_ = 0x2f;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_98,1);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  paVar3 = local_f8.second.
           super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_f8.second.
      super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_f8.second.
      super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar7 = local_f8.second.
             super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      lVar6 = 1;
      do {
        local_98.indices._0_1_ = 9;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)&local_98,1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      local_98.indices._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_98,1);
      paVar7 = paVar7 + 1;
    } while (paVar7 != paVar3);
  }
  if (local_f8.second.
      super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.second.
                    super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<std::bitset<128UL>,_std::allocator<std::bitset<128UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.
                    super__Vector_base<std::bitset<128UL>,_std::allocator<std::bitset<128UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void get_max_cover_static2(const std::vector<Set>& sets, const std::unordered_map<std::string, size_t>& names,
    const std::vector<size_t>& _begin, const std::vector<size_t>& _end, bool print_progress = false)
{
    const std::vector<std::bitset<n_entities>> binary_sets = BitSetsFromSets<n_entities>(sets, names);
    const auto n = sets.size();
    const auto N = nchoosek(n, k);
    
    typedef std::array<size_t, k> collection;
    
    collection indices, end;

    for (size_t i = 0; i < k; ++i)
    {
        indices[i] = _begin[i];
        end[i] = _end[i];
    }

    std::pair<size_t, std::vector<collection>> best;
    best.first = 0; best.second.clear();
    size_t this_count = 0;
    size_t progress = 0;
    ProgressIndicator("\r%zu/%zu @ %zu/%zu", print_progress, [&]()
    {
        int i;
        int b = 0; // first index where 'indices' and 'end' differ
        for (; b < k; ++b)
            if (indices[b] != end[b])
                break;

        // https://docs.python.org/2/library/itertools.html#itertools.combinations
        while (running && b < k)
        {
            //for (auto x : indices)
            //    std::cerr << x << '\t';
            //std::cerr << std::endl;

            this_count = sets_union(binary_sets, indices);
            if (this_count > best.first)
            {
                best.second.clear();
                best.second.push_back(indices);
                best.first = this_count;
            }
            else if (this_count == best.first)
            {
                best.second.push_back(indices);
            }
            ++progress;

            for (i = k - 1; i >= b; --i)
                if (indices[i] != (i + n) - k)
                    break;

            if (i < b)
                break;

            indices[i] += 1;
            for (size_t j = i + 1; j < k; ++j)
                indices[j] = indices[j - 1] + 1;
            if (i == b) // recalculates place of first differ
                for (; b < k; ++b)
                    if (indices[b] != end[b])
                        break;
        }
    }, best.first, names.size(), progress, N);
    
    std::cout << best.first << '/' << names.size() << std::endl;
    for (const auto& collection : best.second)
    {
        std::cout << collection[0];
        for (size_t j = 1; j < k; ++j)
        {
            std::cout << '\t' << collection[j];
        }
        std::cout << '\n';
    }
}